

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

void __thiscall MatroskaDemuxer::readClose(MatroskaDemuxer *this)

{
  AVPacket *pAVar1;
  Track *pTVar2;
  _Elt_pointer ppAVar3;
  long lVar4;
  
  if (this->writing_app != (char *)0x0) {
    operator_delete__(this->writing_app);
  }
  if (this->muxing_app != (char *)0x0) {
    operator_delete__(this->muxing_app);
  }
  ppAVar3 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur != ppAVar3) {
    do {
      pAVar1 = *ppAVar3;
      if (pAVar1->data != (uint8_t *)0x0) {
        operator_delete__(pAVar1->data);
      }
      if (pAVar1 != (AVPacket *)0x0) {
        operator_delete(pAVar1,0x50);
      }
      std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::pop_front(&(this->packets).c);
      ppAVar3 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl
                .super__Deque_impl_data._M_start._M_cur;
    } while ((this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != ppAVar3);
  }
  if (0 < (this->super_IOContextDemuxer).num_tracks) {
    lVar4 = 0;
    do {
      pTVar2 = (this->super_IOContextDemuxer).tracks[lVar4];
      if (pTVar2 != (Track *)0x0) {
        operator_delete__(pTVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_IOContextDemuxer).num_tracks);
  }
  return;
}

Assistant:

void MatroskaDemuxer::readClose()
{
    delete[] writing_app;
    delete[] muxing_app;
    while (!packets.empty())
    {
        const AVPacket *pkt = packets.front();
        delete[] pkt->data;
        delete pkt;
        packets.pop();
    }
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
}